

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O2

void __thiscall Token::removeBrace(Token *this,char open,char close)

{
  size_t index;
  size_t sVar1;
  
  while( true ) {
    index = std::__cxx11::string::find((char)this,(ulong)(uint)(int)open);
    if (index == 0xffffffffffffffff) {
      return;
    }
    sVar1 = braceEnd(&this->content,index,open,close);
    if (sVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::erase((ulong)this,index);
  }
  return;
}

Assistant:

void removeBrace(char open, char close) {
        size_t start = content.find(open);
        while (start != std::string::npos) {
            const size_t end = braceEnd(content, start, open, close);
            if (end == std::string::npos) {
                return;
            }

            content.erase(start, end - start + 1);

            start = content.find(open);
        }
    }